

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  bool bVar2;
  size_type sVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint64_t uVar8;
  size_t sVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  char *pcVar14;
  int64_t iVar15;
  int iVar16;
  ulong uVar17;
  long lVar18;
  bool bVar19;
  pair<long,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pVar20;
  pair<unsigned_long,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pVar21;
  string crcspec;
  string srcFilename;
  ArgIterator __begin1;
  string dstFilename;
  long local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  ArgIterator local_a8;
  int64_t local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  int64_t local_40;
  int64_t local_38;
  
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  local_e8._M_string_length = 0;
  local_e8.field_2._M_local_buf[0] = '\0';
  local_a8.i = 1;
  local_a8.longmatch = false;
  local_a8.isoption = false;
  local_a8.argv = argv;
  local_a8.argc = argc;
  if (argc == 1) {
switchD_00105716_caseD_64:
    usage();
  }
  else {
    local_a8.p = argv[1];
    cVar1 = *local_a8.p;
    local_a8.pend = local_a8.p;
    while (cVar1 != '\0') {
      cVar1 = local_a8.pend[1];
      local_a8.pend = local_a8.pend + 1;
    }
    iVar16 = 0;
    iVar6 = 1;
    local_70 = 0;
    bVar2 = false;
    local_68 = 0;
    local_78 = 0;
    do {
      iVar5 = ArgParser::ArgIterator::option(&local_a8);
      switch(iVar5) {
      case 0x61:
        g_dumpformat = DUMP_STRINGS;
        break;
      case 0x62:
        local_40 = ArgParser::ArgIterator::getint(&local_a8);
        local_78 = CONCAT71((int7)((ulong)local_40 >> 8),1);
        break;
      case 99:
        bVar19 = ArgParser::ArgIterator::match(&local_a8,"-crc");
        if (bVar19) {
          g_dumpformat = DUMP_CRC32;
          pcVar14 = ArgParser::ArgIterator::getstr(&local_a8);
          sVar3 = local_e8._M_string_length;
          sVar9 = strlen(pcVar14);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_replace(&local_e8,0,sVar3,pcVar14,sVar9);
        }
        else {
          g_dumpformat = DUMP_RAW;
        }
        break;
      case 100:
      case 0x67:
      case 0x69:
      case 0x6a:
      case 0x6b:
      case 0x6e:
      case 0x70:
      case 0x71:
      case 0x74:
      case 0x75:
      case 0x76:
        goto switchD_00105716_caseD_64;
      case 0x65:
        local_f8 = ArgParser::ArgIterator::getint(&local_a8);
        bVar2 = true;
        break;
      case 0x66:
        g_fulldump = true;
        break;
      case 0x68:
        g_dumpformat = DUMP_HASHES;
        break;
      case 0x6c:
        local_80 = ArgParser::ArgIterator::getint(&local_a8);
        local_68 = CONCAT71((int7)((ulong)local_80 >> 8),1);
        break;
      case 0x6d:
        bVar19 = ArgParser::ArgIterator::match(&local_a8,"-md5");
        if (bVar19) {
          g_dumpformat = DUMP_HASH;
          g_hashtype = 1;
        }
        else {
          bVar19 = ArgParser::ArgIterator::match(&local_a8,"-md4");
          if (bVar19) {
            g_dumpformat = DUMP_HASH;
            g_hashtype = 0;
          }
          else {
            bVar19 = ArgParser::ArgIterator::match(&local_a8,"-md160");
            if (bVar19) goto LAB_0010594f;
          }
        }
        break;
      case 0x6f:
        local_38 = ArgParser::ArgIterator::getint(&local_a8);
        local_70 = CONCAT71((int7)((ulong)local_38 >> 8),1);
        break;
      case 0x72:
        bVar19 = ArgParser::ArgIterator::match(&local_a8,"-ripemd160");
        if (bVar19) {
LAB_0010594f:
          g_dumpformat = DUMP_HASH;
          g_hashtype = 6;
        }
        else {
          uVar8 = ArgParser::ArgIterator::getuint(&local_a8);
          g_chunksize = (uint32_t)uVar8;
        }
        break;
      case 0x73:
        bVar19 = ArgParser::ArgIterator::match(&local_a8,"-sha256");
        if (bVar19) {
          g_dumpformat = DUMP_HASH;
          g_hashtype = 3;
        }
        else {
          bVar19 = ArgParser::ArgIterator::match(&local_a8,"-sha384");
          if (bVar19) {
            g_dumpformat = DUMP_HASH;
            g_hashtype = 4;
          }
          else {
            bVar19 = ArgParser::ArgIterator::match(&local_a8,"-sha512");
            if (bVar19) {
              g_dumpformat = DUMP_HASH;
              g_hashtype = 5;
            }
            else {
              bVar19 = ArgParser::ArgIterator::match(&local_a8,"-sum");
              if (bVar19) {
                g_dumpformat = DUMP_SUM;
              }
              else {
                g_llStepSize = ArgParser::ArgIterator::getint(&local_a8);
              }
            }
          }
        }
        break;
      case 0x77:
        iVar15 = ArgParser::ArgIterator::getint(&local_a8);
        g_nMaxUnitsPerLine = (int)iVar15;
        break;
      case 0x78:
        iVar5 = ArgParser::ArgIterator::count(&local_a8);
        if (iVar5 == 2) {
          g_dumpformat = DUMP_ASCII;
        }
        else {
          g_dumpformat = DUMP_HEX;
        }
        break;
      default:
        uVar12 = iVar5 - 0x31;
        if (uVar12 < 0x23) {
          if ((0x8bUL >> ((ulong)uVar12 & 0x3f) & 1) == 0) {
            if ((ulong)uVar12 != 0x22) goto LAB_00105765;
            uVar8 = ArgParser::ArgIterator::getuint(&local_a8);
            g_summarizeThreshold = (int)uVar8;
          }
          else {
            iVar6 = ArgParser::ArgIterator::option(&local_a8);
            iVar6 = iVar6 + -0x30;
          }
        }
        else {
LAB_00105765:
          if (1 < iVar5 + 1U) goto switchD_00105716_caseD_64;
          if (iVar16 == 1) {
            pcVar14 = ArgParser::ArgIterator::getstr(&local_a8);
            sVar3 = local_60._M_string_length;
            sVar9 = strlen(pcVar14);
            iVar16 = 2;
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_replace(&local_60,0,sVar3,pcVar14,sVar9);
          }
          else if (iVar16 == 0) {
            pcVar14 = ArgParser::ArgIterator::getstr(&local_a8);
            sVar3 = local_c8._M_string_length;
            sVar9 = strlen(pcVar14);
            iVar16 = 1;
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_replace(&local_c8,0,sVar3,pcVar14,sVar9);
          }
          else {
            iVar16 = iVar16 + 1;
          }
        }
      }
      if (local_a8.i == local_a8.argc) {
        bVar19 = local_a8.p != (char *)0x0;
        iVar7 = local_a8.i;
      }
      else {
        iVar5 = local_a8.i + 1;
        local_a8.longmatch = false;
        local_a8.isoption = false;
        if (iVar5 == local_a8.argc) {
          local_a8.p = (char *)0x0;
          local_a8.pend = (char *)0x0;
          bVar19 = false;
          iVar7 = local_a8.argc;
          local_a8.i = iVar5;
        }
        else {
          local_a8.p = local_a8.argv[(long)local_a8.i + 1];
          if (*local_a8.p == '\0') {
            lVar10 = 0;
          }
          else {
            lVar11 = 0;
            do {
              lVar10 = lVar11 + 1;
              lVar18 = lVar11 + 1;
              lVar11 = lVar10;
            } while (local_a8.p[lVar18] != '\0');
          }
          local_a8.pend = local_a8.p + lVar10;
          bVar19 = true;
          iVar7 = iVar5;
          local_a8.i = iVar5;
        }
      }
    } while ((iVar7 != argc) || (bVar19));
    if (iVar16 == 0 || 2 < iVar16) goto switchD_00105716_caseD_64;
    if (local_e8._M_string_length != 0) {
      pVar20 = parsesigned<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                         ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           )local_e8._M_dataplus._M_p,
                          (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           )(local_e8._M_dataplus._M_p + local_e8._M_string_length),0);
      g_crc_initval = pVar20.first;
      if (pVar20.second._M_current._M_current !=
          local_e8._M_dataplus._M_p + local_e8._M_string_length) {
        pVar21 = parseunsigned<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                           ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             )(pVar20.second._M_current._M_current + 1),
                            (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             )(local_e8._M_dataplus._M_p + local_e8._M_string_length),0);
        g_crc_poly = pVar21.first;
        if (pVar21.second._M_current._M_current !=
            local_e8._M_dataplus._M_p + local_e8._M_string_length) {
          pVar21 = parseunsigned<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                             ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               )(pVar21.second._M_current._M_current + 1),
                              (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               )(local_e8._M_dataplus._M_p + local_e8._M_string_length),0);
          g_crc_bits = pVar21.first;
        }
      }
    }
    if (g_nMaxUnitsPerLine < 0) {
      if (g_dumpformat == DUMP_HEX) {
        lVar10 = 0x20;
      }
      else if (g_dumpformat == DUMP_ASCII) {
        lVar10 = 0x40;
      }
      else {
        if (4 < (int)g_dumpformat) {
          g_nMaxUnitsPerLine = (int)g_llStepSize;
          goto LAB_00105c63;
        }
        lVar10 = 0x10;
      }
      g_nMaxUnitsPerLine = (int)(lVar10 / (long)iVar6);
    }
LAB_00105c63:
    if (iVar6 == 1) {
      g_dumpunit = DUMPUNIT_BYTE;
    }
    else if (iVar6 == 2) {
      g_dumpunit = DUMPUNIT_WORD;
    }
    else if (iVar6 == 4) {
      g_dumpunit = DUMPUNIT_DWORD;
    }
    else {
      g_dumpunit = (uint)(iVar6 == 8) * 3;
    }
    iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&local_c8,"-");
    iVar15 = local_38;
    uVar17 = local_68;
    uVar4 = local_70;
    if (iVar6 == 0) {
      lVar10 = -1;
    }
    else {
      lVar10 = GetFileSize(&local_c8);
    }
    bVar19 = (local_78 & 1) != 0;
    lVar11 = 0;
    if (bVar19) {
      lVar11 = local_40;
    }
    uVar12 = 1;
    if (bVar19) {
      uVar12 = (uint)local_78 & 0xff;
    }
    uVar13 = (ulong)uVar12;
    lVar18 = lVar11;
    if ((uVar4 & 1) != 0) {
      if (-1 < iVar15) {
        uVar13 = uVar4 & 0xffffffff;
        lVar18 = iVar15;
        goto LAB_00105d43;
      }
      if (iVar6 != 0 && -1 < lVar10) {
        if ((uVar12 & 1) == 0) {
          std::__throw_bad_optional_access();
        }
        lVar18 = iVar15 + lVar11 + lVar10;
        uVar13 = 1;
        goto LAB_00105d43;
      }
      pcVar14 = "dumping end of stdin stream not yet implemented";
      goto LAB_00105e2e;
    }
LAB_00105d43:
    if ((uVar17 & 1) == 0) {
      if (bVar2) {
        if (local_f8 < 0) {
          if (iVar6 == 0 || lVar10 < 0) {
            pcVar14 = "Can\'t use negative offsets, on stdin";
            goto LAB_00105e2e;
          }
          local_f8 = local_f8 + lVar10;
        }
        if ((uVar13 & 1) == 0) {
          std::__throw_bad_optional_access();
        }
        iVar15 = local_f8 - lVar18;
      }
      else {
        if (-1 < lVar10) {
          if ((uVar12 & 1) == 0) {
            std::__throw_bad_optional_access();
          }
          if ((uVar13 & 1) == 0) {
            std::__throw_bad_optional_access();
          }
          iVar15 = (lVar10 + lVar11) - lVar18;
          uVar17 = 1;
          goto LAB_00105e18;
        }
        if ((uVar13 & 1) == 0) goto LAB_00105ec3;
        iVar15 = 0x7fffffffffffffff;
      }
      uVar17 = 1;
LAB_00105e18:
      if ((uVar12 & 1) == 0) goto LAB_00105ec3;
      if (lVar11 <= lVar18) {
        if (local_60._M_string_length == 0) {
          if (g_llStepSize == 0) {
            if ((uVar17 & 1) == 0) goto LAB_00105ec3;
            Dumpfile(&local_c8,lVar11,lVar18,iVar15);
          }
          else {
            if ((uVar17 & 1) == 0) goto LAB_00105ec3;
            StepFile(&local_c8,lVar11,lVar18,iVar15);
          }
        }
        else if (g_llStepSize == 0) {
          if ((uVar17 & 1) == 0) goto LAB_00105ec3;
          Copyfile(&local_c8,&local_60,lVar11,lVar18,iVar15);
        }
        else {
          if ((uVar17 & 1) == 0) {
LAB_00105ec3:
            std::__throw_bad_optional_access();
          }
          CopyFileSteps(&local_c8,&local_60,lVar11,lVar18,iVar15);
        }
        iVar6 = 0;
        goto LAB_00105b49;
      }
      pcVar14 = "offset must be >= baseoffset";
    }
    else {
      iVar15 = local_80;
      if (bVar2) {
        if ((uVar13 & 1) == 0) {
          std::__throw_bad_optional_access();
        }
        if (local_f8 == lVar18 + local_80) goto LAB_00105e18;
        pcVar14 = "inconsistent use of -l, -o and -e";
      }
      else {
        if (-1 < local_80) {
          if ((uVar13 & 1) == 0) {
            std::__throw_bad_optional_access();
          }
          goto LAB_00105e18;
        }
        pcVar14 = "Can\'t use negative length";
      }
    }
LAB_00105e2e:
    puts(pcVar14);
  }
  iVar6 = 1;
LAB_00105b49:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,
                    CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                             local_e8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,
                    CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                             local_60.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,
                    CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                             local_c8.field_2._M_local_buf[0]) + 1);
  }
  return iVar6;
}

Assistant:

int main(int argc, char **argv)
{
    std::optional<int64_t> llOffset;
    std::optional<int64_t> llEndOffset;
    std::optional<int64_t> llLength;
    std::optional<int64_t> llBaseOffset;

    std::string srcFilename;
    std::string dstFilename;
    int nDumpUnitSize = 1;
    std::string crcspec;

    int argsfound = 0; 

    for (auto& arg : ArgParser(argc, argv))
        switch(arg.option())
        {
            case 'b': llBaseOffset = arg.getint(); break;
            case 'o': llOffset = arg.getint(); break;
            case 'e': llEndOffset = arg.getint(); break;
            case 'l': llLength = arg.getint(); break;

            case 'h': g_dumpformat= DUMP_HASHES; break;
            case 'r': 
#if !defined(__ANDROID__)
#ifdef RIPEMD160_DIGEST_LENGTH
                      if (arg.match("-ripemd160")) {
                          g_dumpformat= DUMP_HASH;
                          g_hashtype= CryptHash::RIPEMD160;
                      }
                      else
#endif
#endif
 
                      g_chunksize = arg.getuint(); break;

            case 'w': g_nMaxUnitsPerLine = arg.getint(); break;
            case 's': if (0)
                          ;
#ifdef SHA1_DIGEST_LENGTH
                      else if (arg.match("-sha1")) {
                          g_dumpformat= DUMP_HASH;
                          g_hashtype= CryptHash::SHA1;
                      }
#endif
#if !defined(__ANDROID__)
#ifdef SHA256_DIGEST_LENGTH
                      else if (arg.match("-sha256")) {
                          g_dumpformat= DUMP_HASH;
                          g_hashtype= CryptHash::SHA256;
                      }
#endif
#ifdef SHA384_DIGEST_LENGTH
                      else if (arg.match("-sha384")) {
                          g_dumpformat= DUMP_HASH;
                          g_hashtype= CryptHash::SHA384;
                      }
#endif
#ifdef SHA512_DIGEST_LENGTH
                      else if (arg.match("-sha512")) {
                          g_dumpformat= DUMP_HASH;
                          g_hashtype= CryptHash::SHA512;
                      }
#endif
#endif

                      else if (arg.match("-sum"))
                          g_dumpformat= DUMP_SUM;
                      else
                          g_llStepSize = arg.getint();
                      break;
            case 'm': if (0)
                          ;
#ifdef MD5_DIGEST_LENGTH
                      else if (arg.match("-md5")) {
                          g_dumpformat= DUMP_HASH; 
                          g_hashtype= CryptHash::MD5;
                      }
#endif
#ifdef MD2_DIGEST_LENGTH
                      else if (arg.match("-md2")) {
                          g_dumpformat= DUMP_HASH; 
                          g_hashtype= CryptHash::MD2;
                      }
#endif
#ifdef MD4_DIGEST_LENGTH
                      else if (arg.match("-md4")) {
                          g_dumpformat= DUMP_HASH; 
                          g_hashtype= CryptHash::MD4;
                      }
#endif
#if !defined(__ANDROID__)
#ifdef RIPEMD160_DIGEST_LENGTH
                      else if (arg.match("-md160")) {
                          g_dumpformat= DUMP_HASH;
                          g_hashtype= CryptHash::RIPEMD160;
                      }
#endif
#endif

                      break;
            case 'a': g_dumpformat= DUMP_STRINGS; break;
            case 'c': if (arg.match("-crc")) {
                          g_dumpformat= DUMP_CRC32; 
                          crcspec = arg.getstr();
                      }
                      else
                          g_dumpformat= DUMP_RAW; 
                      break;
            case 'f': g_fulldump= true; break;
            case 'S': g_summarizeThreshold = arg.getuint(); break;
            case 'x': if (arg.count()==2)
                          g_dumpformat= DUMP_ASCII; 
                      else
                          g_dumpformat= DUMP_HEX; 
                      break;
            case '1': case '2': case '4': case '8':
                nDumpUnitSize= arg.option()-'0';
                break;
            case 0: // single '-'
            case -1:
                switch (argsfound++) {
                    case 0: srcFilename= arg.getstr(); break;
                    case 1: dstFilename= arg.getstr(); break;
                }
                break;

            default:
                usage();
                return 1;
        }
    if (argsfound==0 || argsfound>2)
    {
        usage();
        return 1;
    }

    if (!crcspec.empty()) {
        auto res1 = parsesigned(crcspec.begin(), crcspec.end(), 0);
        g_crc_initval= res1.first;
        if (res1.second!=crcspec.end()) {
            auto res2 = parseunsigned(res1.second+1, crcspec.end(), 0);
            g_crc_poly= res2.first;
            if (res2.second!=crcspec.end()) {
                auto res3 = parseunsigned(res2.second+1, crcspec.end(), 0);
                g_crc_bits= res3.first;

            }
        }
    }

    // 64 = highest 2^n, such that addrsize + 2^n <= screenwidth
    // 32 = highest 2^n, such that addrsize + 3*2^n <= screenwidth+25 ...
    // 16 = highest 2^n, such that addrsize + 4*2^n <= screenwidth
    if (g_nMaxUnitsPerLine<0) {
        if (g_dumpformat==DUMP_ASCII) 
            g_nMaxUnitsPerLine= 64/nDumpUnitSize;
        else if (g_dumpformat==DUMP_HEX) 
            g_nMaxUnitsPerLine= 32/nDumpUnitSize;
        else if (g_dumpformat>=DUMP_HASH)
            g_nMaxUnitsPerLine= g_llStepSize;
        else
            g_nMaxUnitsPerLine= 16/nDumpUnitSize;
    }

    g_dumpunit= 
        nDumpUnitSize==1?DUMPUNIT_BYTE:
        nDumpUnitSize==2?DUMPUNIT_WORD:
        nDumpUnitSize==4?DUMPUNIT_DWORD:
        nDumpUnitSize==8?DUMPUNIT_QWORD:DUMPUNIT_BYTE;

    if (g_dumpformat==DUMP_RAW) {
#ifdef WIN32
        if (-1==_setmode( _fileno( stdout ), _O_BINARY )) {
            print("ERROR: _setmode(stdout, rb)");
            return 1;
        }
#endif
    }

    bool fromStdin= srcFilename=="-";

    int64_t llFileSize= fromStdin ? -1 : GetFileSize(srcFilename);

    if (!llBaseOffset)
        llBaseOffset = 0;

    // determine start
    if (!llOffset)
        llOffset = llBaseOffset;
    else if (llOffset.value() < 0) {
        if (fromStdin || llFileSize < 0) {
            printf("dumping end of stdin stream not yet implemented\n");
            return 1;
        }
        llOffset = llBaseOffset.value() + llOffset.value() + llFileSize;
    }

    // determine end
    if (!llLength && !llEndOffset)
    {
        if (llFileSize >= 0) {
            llEndOffset = llBaseOffset.value() + llFileSize;
            llLength = llEndOffset.value() - llOffset.value();
        }
        // else: filesize, length unknown - until EOF.
        else {
            llEndOffset = INT64_MAX;
            llLength = INT64_MAX;
        }
    }
    else if (!llLength && llEndOffset) {
        if (llEndOffset < 0) {
            if (fromStdin || llFileSize < 0) {
                printf("Can't use negative offsets, on stdin\n");
                return 1;
            }
            llEndOffset = llEndOffset.value() + llFileSize;
        }
        llLength = llEndOffset.value() - llOffset.value();
    }
    else if (llLength && !llEndOffset) {
        if (llLength < 0) {
            printf("Can't use negative length\n");
            return 1;
        }
        llEndOffset = llOffset.value() + llLength.value();
    }
    else {
        if (llEndOffset != llOffset.value() + llLength.value()) {
            printf("inconsistent use of -l, -o and -e\n");
            return 1;
        }
    }

    if (llOffset.value() < llBaseOffset.value()) {
        printf("offset must be >= baseoffset\n");
        return 1;
    }


    if (!dstFilename.empty()) {
        if (g_llStepSize)
            CopyFileSteps(srcFilename, dstFilename, llBaseOffset.value(), llOffset.value(), llLength.value());
        else
            Copyfile(srcFilename, dstFilename, llBaseOffset.value(), llOffset.value(), llLength.value());
    }
    else {
        if (g_llStepSize)
            StepFile(srcFilename, llBaseOffset.value(), llOffset.value(), llLength.value());
        else
            Dumpfile(srcFilename, llBaseOffset.value(), llOffset.value(), llLength.value());
    }

    return 0;
}